

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_window_is_collapsed(nk_context *ctx,char *name)

{
  int len;
  nk_hash hash;
  nk_window *pnVar1;
  nk_window *win;
  nk_hash title_hash;
  int title_len;
  char *name_local;
  nk_context *ctx_local;
  
  if (ctx != (nk_context *)0x0) {
    if (ctx == (nk_context *)0x0) {
      ctx_local._4_4_ = 0;
    }
    else {
      len = nk_strlen(name);
      hash = nk_murmur_hash(name,len,0x40);
      pnVar1 = nk_find_window(ctx,hash,name);
      if (pnVar1 == (nk_window *)0x0) {
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = pnVar1->flags & 0x8000;
      }
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x49e5,"int nk_window_is_collapsed(struct nk_context *, const char *)");
}

Assistant:

NK_API int
nk_window_is_collapsed(struct nk_context *ctx, const char *name)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return 0;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) return 0;
    return win->flags & NK_WINDOW_MINIMIZED;
}